

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  Rep *pRVar2;
  undefined1 uVar3;
  string sVar4;
  int iVar5;
  Type TVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FieldDescriptor *this_00;
  undefined4 extraout_var_01;
  FieldDescriptor *this_01;
  LogMessage *other;
  KeyValue KVar9;
  MapValueRef *pMVar10;
  long *plVar11;
  string *this_02;
  long lVar12;
  void **ppvVar13;
  void **ppvVar14;
  iterator iter;
  LogFinisher local_99;
  KeyValue local_98;
  InnerMap *pIStack_90;
  size_type local_88;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [2];
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_40;
  DynamicMapField *local_38;
  long *plVar8;
  
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar8 = (long *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"key","");
  this_00 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_00,iVar5),(string *)local_78);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_68[0]._M_allocated_capacity + 1);
  }
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"value","");
  this_01 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_01,iVar5),(string *)local_78);
  if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,local_68[0]._M_allocated_capacity + 1);
  }
  local_40 = &this->map_;
  local_78._8_8_ = (this->map_).elements_;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::SearchFrom((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                *)local_78,((InnerMap *)local_78._8_8_)->index_of_first_non_null_);
  local_88 = local_68[0]._M_allocated_capacity;
  local_98.string_value_ = (string *)local_78._0_8_;
  pIStack_90 = (InnerMap *)local_78._8_8_;
  if ((string *)local_78._0_8_ != (string *)0x0) {
    do {
      MapValueRef::DeleteData
                ((MapValueRef *)(((local_98.string_value_)->field_2)._M_allocated_capacity + 0x10));
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
      ::operator++((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                    *)&local_98);
    } while (local_98.string_value_ != (string *)0x0);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(local_40);
  pRVar1 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  if ((pRVar1->super_RepeatedPtrFieldBase).current_size_ != 0) {
    pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
    ppvVar14 = pRVar2->elements;
    local_38 = this;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar14 = (void **)0x0;
    }
    do {
      pIStack_90 = (InnerMap *)((ulong)pIStack_90 & 0xffffffff00000000);
      TVar6 = FieldDescriptor::type(this_00);
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4)) {
      case 1:
        uVar7 = (**(code **)(*plVar8 + 0x88))(plVar8,*ppvVar14,this_00);
        MapKey::SetType((MapKey *)&local_98,CPPTYPE_INT32);
        goto LAB_005b67bf;
      case 2:
        KVar9.string_value_ = (string *)(**(code **)(*plVar8 + 0x90))(plVar8,*ppvVar14,this_00);
        MapKey::SetType((MapKey *)&local_98,CPPTYPE_INT64);
        local_98.string_value_ = KVar9.string_value_;
        break;
      case 3:
        uVar7 = (**(code **)(*plVar8 + 0x98))(plVar8,*ppvVar14,this_00);
        MapKey::SetType((MapKey *)&local_98,CPPTYPE_UINT32);
LAB_005b67bf:
        local_98.int32_value_ = uVar7;
        break;
      case 4:
        KVar9.string_value_ = (string *)(**(code **)(*plVar8 + 0xa0))(plVar8,*ppvVar14,this_00);
        MapKey::SetType((MapKey *)&local_98,CPPTYPE_UINT64);
        local_98.string_value_ = KVar9.string_value_;
        break;
      case 5:
      case 6:
      case 8:
      case 10:
        LogMessage::LogMessage
                  ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                   ,0x16e);
        other = LogMessage::operator<<((LogMessage *)local_78,"Can\'t get here.");
        LogFinisher::operator=(&local_99,other);
        LogMessage::~LogMessage((LogMessage *)local_78);
        break;
      case 7:
        uVar3 = (**(code **)(*plVar8 + 0xb8))(plVar8,*ppvVar14,this_00);
        MapKey::SetType((MapKey *)&local_98,CPPTYPE_BOOL);
        local_98.bool_value_ = (bool)uVar3;
        break;
      case 9:
        (**(code **)(*plVar8 + 0xc0))(local_78,plVar8,*ppvVar14);
        MapKey::SetType((MapKey *)&local_98,CPPTYPE_STRING);
        std::__cxx11::string::_M_assign((string *)local_98.string_value_);
        if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,local_68[0]._M_allocated_capacity + 1);
        }
      }
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
                ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
                  *)local_78,(this->map_).elements_,(MapKey *)&local_98,(TreeIterator *)0x0);
      if ((string *)local_78._0_8_ != (string *)0x0) {
        MapValueRef::DeleteData((MapValueRef *)(*(long *)(local_78._0_8_ + 0x10) + 0x10));
      }
      pMVar10 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                          (local_40,(key_type *)&local_98);
      TVar6 = FieldDescriptor::type(this_01);
      pMVar10->type_ = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4);
      TVar6 = FieldDescriptor::type(this_01);
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4)) {
      case 1:
        this_02 = (string *)operator_new(4);
        uVar7 = (**(code **)(*plVar8 + 0x88))(plVar8,*ppvVar14,this_01);
        goto LAB_005b6983;
      case 2:
        this_02 = (string *)operator_new(8);
        lVar12 = (**(code **)(*plVar8 + 0x90))(plVar8,*ppvVar14,this_01);
        goto LAB_005b69aa;
      case 3:
        this_02 = (string *)operator_new(4);
        uVar7 = (**(code **)(*plVar8 + 0x98))(plVar8,*ppvVar14,this_01);
        goto LAB_005b6983;
      case 4:
        this_02 = (string *)operator_new(8);
        lVar12 = (**(code **)(*plVar8 + 0xa0))(plVar8,*ppvVar14,this_01);
LAB_005b69aa:
        *(long *)this_02 = lVar12;
        break;
      case 5:
        this_02 = (string *)operator_new(8);
        lVar12 = (**(code **)(*plVar8 + 0xb0))(plVar8,*ppvVar14,this_01);
        *(long *)this_02 = lVar12;
        break;
      case 6:
        this_02 = (string *)operator_new(4);
        uVar7 = (**(code **)(*plVar8 + 0xa8))(plVar8,*ppvVar14,this_01);
        *(undefined4 *)this_02 = uVar7;
        break;
      case 7:
        this_02 = (string *)operator_new(1);
        sVar4 = (string)(**(code **)(*plVar8 + 0xb8))(plVar8,*ppvVar14,this_01);
        *this_02 = sVar4;
        break;
      case 8:
        this_02 = (string *)operator_new(4);
        uVar7 = (**(code **)(*plVar8 + 0xd0))(plVar8,*ppvVar14,this_01);
LAB_005b6983:
        *(undefined4 *)this_02 = uVar7;
        break;
      case 9:
        this_02 = (string *)operator_new(0x20);
        *(string **)this_02 = this_02 + 0x10;
        *(undefined8 *)(this_02 + 8) = 0;
        this_02[0x10] = (string)0x0;
        (**(code **)(*plVar8 + 0xc0))((string *)local_78,plVar8,*ppvVar14,this_01);
        std::__cxx11::string::operator=(this_02,(string *)local_78);
        if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,local_68[0]._M_allocated_capacity + 1);
        }
        break;
      case 10:
        plVar11 = (long *)(**(code **)(*plVar8 + 0xd8))(plVar8,*ppvVar14,this_01,0);
        this_02 = (string *)(**(code **)(*plVar11 + 0x18))(plVar11);
        (**(code **)(*(long *)this_02 + 0x88))(this_02,plVar11);
        break;
      default:
        goto switchD_005b689c_default;
      }
      pMVar10->data_ = this_02;
      this = local_38;
switchD_005b689c_default:
      MapKey::~MapKey((MapKey *)&local_98);
      ppvVar14 = ppvVar14 + 1;
      pRVar1 = (this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_;
      pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
      ppvVar13 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar13 = (void **)0x0;
      }
    } while (ppvVar14 != ppvVar13 + (pRVar1->super_RepeatedPtrFieldBase).current_size_);
  }
  return;
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    // Remove existing map value with same key.
    Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
    if (iter != map->end()) {
      iter->second.DeleteData();
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                      \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        TYPE * value = new TYPE;                                \
        *value = reflection->Get##METHOD(*it, val_des);         \
            map_val.SetValue(value);                            \
            break;                                              \
      }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New();
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}